

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<int,phmap::priv::(anonymous_namespace)::NodeHashMap_AssignRecursive_Test::TestBody()::Tree>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::NodeHashMap_AssignRecursive_Test::TestBody()::Tree>>>
::
emplace_at<std::pair<int_const,phmap::priv::(anonymous_namespace)::NodeHashMap_AssignRecursive_Test::TestBody()::Tree>const&>
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<int,phmap::priv::(anonymous_namespace)::NodeHashMap_AssignRecursive_Test::TestBody()::Tree>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::NodeHashMap_AssignRecursive_Test::TestBody()::Tree>>>
           *this,size_t i,pair<const_int,_Tree> *args)

{
  allocator_type *alloc;
  pair<const_int,_Tree> *args_local;
  size_t i_local;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
  *this_local;
  
  alloc = raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
          ::alloc_ref((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
                       *)this);
  hash_policy_traits<phmap::priv::NodeHashMapPolicy<int,phmap::priv::(anonymous_namespace)::NodeHashMap_AssignRecursive_Test::TestBody()::Tree>,void>
  ::
  construct<std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::NodeHashMap_AssignRecursive_Test::TestBody()::Tree>>,std::pair<int_const,phmap::priv::(anonymous_namespace)::NodeHashMap_AssignRecursive_Test::TestBody()::Tree>const&>
            (alloc,(slot_type *)(*(long *)(this + 8) + i * 8),args);
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);
        
#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
        // this check can be costly, so do it only when requested
        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
#endif
    }